

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O2

void test_inverse_field(secp256k1_fe *out,secp256k1_fe *x,int var)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  code *pcVar4;
  secp256k1_fe l;
  secp256k1_fe t;
  secp256k1_fe r;
  
  pcVar4 = secp256k1_fe_inv_var;
  if (var == 0) {
    pcVar4 = secp256k1_fe_inv;
  }
  (*pcVar4)(&l);
  if (out != (secp256k1_fe *)0x0) {
    out->n[4] = l.n[4];
    out->magnitude = l.magnitude;
    out->normalized = l.normalized;
    out->n[2] = l.n[2];
    out->n[3] = l.n[3];
    out->n[0] = l.n[0];
    out->n[1] = l.n[1];
  }
  t.n[0] = x->n[0];
  t.n[1] = x->n[1];
  t.n[2] = x->n[2];
  t.n[3] = x->n[3];
  t.n[4] = x->n[4];
  t.magnitude = x->magnitude;
  t.normalized = x->normalized;
  iVar1 = secp256k1_fe_normalizes_to_zero_var(&t);
  if (iVar1 == 0) {
    secp256k1_fe_mul(&t,x,&l);
    secp256k1_fe_add(&t,&fe_minus_one);
    iVar1 = secp256k1_fe_normalizes_to_zero(&t);
    if (iVar1 != 0) {
      r.n[0] = x->n[0];
      r.n[1] = x->n[1];
      r.n[2] = x->n[2];
      r.n[3] = x->n[3];
      r.n[4] = x->n[4];
      r.magnitude = x->magnitude;
      r.normalized = x->normalized;
      secp256k1_fe_add(&r,&fe_minus_one);
      iVar1 = secp256k1_fe_normalizes_to_zero_var(&r);
      if (iVar1 == 0) {
        (*pcVar4)(&r,&r);
        secp256k1_fe_add(&l,&fe_minus_one);
        (*pcVar4)(&l,&l);
        secp256k1_fe_add_int(&l,1);
        secp256k1_fe_add(&l,&r);
        iVar1 = secp256k1_fe_normalizes_to_zero_var(&l);
        if (iVar1 == 0) {
          pcVar3 = "test condition failed: secp256k1_fe_normalizes_to_zero_var(&l)";
          uVar2 = 0xd9f;
          goto LAB_0013437e;
        }
      }
      return;
    }
    pcVar3 = "test condition failed: secp256k1_fe_normalizes_to_zero(&t)";
    uVar2 = 0xd96;
  }
  else {
    iVar1 = secp256k1_fe_normalizes_to_zero(&l);
    if (iVar1 != 0) {
      return;
    }
    pcVar3 = "test condition failed: secp256k1_fe_normalizes_to_zero(&l)";
    uVar2 = 0xd91;
  }
LAB_0013437e:
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

static void test_inverse_field(secp256k1_fe* out, const secp256k1_fe* x, int var)
{
    secp256k1_fe l, r, t;

    (var ? secp256k1_fe_inv_var : secp256k1_fe_inv)(&l, x) ;   /* l = 1/x */
    if (out) *out = l;
    t = *x;                                                    /* t = x */
    if (secp256k1_fe_normalizes_to_zero_var(&t)) {
        CHECK(secp256k1_fe_normalizes_to_zero(&l));
        return;
    }
    secp256k1_fe_mul(&t, x, &l);                               /* t = x*(1/x) */
    secp256k1_fe_add(&t, &fe_minus_one);                       /* t = x*(1/x)-1 */
    CHECK(secp256k1_fe_normalizes_to_zero(&t));                /* x*(1/x)-1 == 0 */
    r = *x;                                                    /* r = x */
    secp256k1_fe_add(&r, &fe_minus_one);                       /* r = x-1 */
    if (secp256k1_fe_normalizes_to_zero_var(&r)) return;
    (var ? secp256k1_fe_inv_var : secp256k1_fe_inv)(&r, &r);   /* r = 1/(x-1) */
    secp256k1_fe_add(&l, &fe_minus_one);                       /* l = 1/x-1 */
    (var ? secp256k1_fe_inv_var : secp256k1_fe_inv)(&l, &l);   /* l = 1/(1/x-1) */
    secp256k1_fe_add_int(&l, 1);                               /* l = 1/(1/x-1)+1 */
    secp256k1_fe_add(&l, &r);                                  /* l = 1/(1/x-1)+1 + 1/(x-1) */
    CHECK(secp256k1_fe_normalizes_to_zero_var(&l));            /* l == 0 */
}